

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void parse_diagnostics(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  bool bVar3;
  double dVar4;
  vw *pvVar5;
  int iVar6;
  option_group_definition *poVar7;
  long lVar8;
  ostream *poVar9;
  bool version_arg;
  bool help;
  string progress_arg;
  option_group_definition diagnostic_group;
  bool local_89a;
  bool local_899;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  bool *local_878;
  vw *local_870;
  string local_868;
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  string local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  string local_7a8;
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  string local_768;
  undefined1 *local_748;
  long local_740;
  undefined1 local_738 [16];
  option_group_definition local_728;
  undefined1 *local_6f0 [2];
  undefined1 local_6e0 [16];
  undefined1 *local_6d0 [2];
  undefined1 local_6c0 [16];
  undefined1 *local_6b0 [2];
  undefined1 local_6a0 [16];
  string local_690;
  undefined1 local_670 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [80];
  string local_580 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [80];
  string local_4e0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [80];
  string local_440 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  typed_option<bool> local_350;
  typed_option<bool> local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  local_89a = false;
  local_899 = false;
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  local_898._M_string_length = 0;
  local_898.field_2._M_local_buf[0] = '\0';
  local_748 = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"Diagnostic options","");
  local_728.m_name._M_dataplus._M_p = (pointer)&local_728.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_728,local_748,local_748 + local_740);
  local_728.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_728.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_728.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_748 != local_738) {
    operator_delete(local_748);
  }
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"version","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_768,&local_89a);
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"Version information","");
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_670);
  poVar7 = VW::config::option_group_definition::add<bool>(&local_728,&local_d0);
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"audit","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_7a8,&all->audit);
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"a","");
  std::__cxx11::string::_M_assign(local_440);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,"print weights of features","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_490);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_170);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"progress","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_530,&local_808,&local_898);
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"P","");
  std::__cxx11::string::_M_assign(local_4e0);
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,"Progress update frequency. int: additive, float: multiplicative",
             "");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_530);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_210);
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"quiet","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_690,&all->quiet);
  local_6b0[0] = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6b0,"Don\'t output disgnostics and progress updates","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_3f0);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_2b0);
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"help","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_868,&local_899);
  local_878 = &all->quiet;
  local_6d0[0] = local_6c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"h","");
  local_870 = all;
  std::__cxx11::string::_M_assign(local_580);
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6f0,"Look here: http://hunch.net/~vw/ and click on Tutorial.","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_5d0);
  VW::config::option_group_definition::add<bool>(poVar7,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0]);
  }
  if (local_6d0[0] != local_6c0) {
    operator_delete(local_6d0[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_002cf500;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_6b0[0] != local_6a0) {
    operator_delete(local_6b0[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002cf500;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf568;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_848[0] != local_838) {
    operator_delete(local_848[0]);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002cf568;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0]);
  }
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002cf500;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cf500;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_788[0] != local_778) {
    operator_delete(local_788[0]);
  }
  local_670._0_8_ = &PTR__typed_option_002cf500;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_728);
  pvVar5 = local_870;
  if (local_89a != true) {
    pp_Var2 = (_func_int **)(local_670 + 0x10);
    local_670._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"progress","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_670);
    if ((char)iVar6 == '\0') {
      if ((_func_int **)local_670._0_8_ != pp_Var2) {
        operator_delete((void *)local_670._0_8_);
      }
    }
    else {
      bVar3 = *local_878;
      if ((_func_int **)local_670._0_8_ != pp_Var2) {
        operator_delete((void *)local_670._0_8_);
      }
      if (bVar3 == false) {
        dVar4 = atof(local_898._M_dataplus._M_p);
        pvVar5->progress_arg = (float)dVar4;
        lVar8 = std::__cxx11::string::find_first_of((char *)&local_898,0x276c35,0);
        if (lVar8 == -1) {
          pvVar5->progress_add = true;
          if (pvVar5->progress_arg <= 1.0 && pvVar5->progress_arg != 1.0) {
            pvVar1 = &pvVar5->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,"warning: additive --progress <int>",0x22);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream," can\'t be < 1: forcing to 1",0x1b);
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
            pvVar5->progress_arg = 1.0;
          }
          pvVar5->sd->dump_interval = pvVar5->progress_arg;
        }
        else {
          pvVar5->progress_add = false;
          if (pvVar5->progress_arg <= 1.0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(pvVar5->trace_message).super_ostream,
                       "warning: multiplicative --progress <float>: ",0x2c);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (&(pvVar5->trace_message).super_ostream,local_898._M_dataplus._M_p,
                                local_898._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," is <= 1.0: adding 1.0",0x16)
            ;
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pvVar5->progress_arg = pvVar5->progress_arg + 1.0;
          }
          else if (9.0 < pvVar5->progress_arg) {
            pvVar1 = &pvVar5->trace_message;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,"warning: multiplicative --progress <float>",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream," is > 9.0: you probably meant to use an integer",0x2f
                      );
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
            std::ostream::put((char)pvVar1);
            std::ostream::flush();
          }
          pvVar5->sd->dump_interval = 1.0;
        }
      }
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_728.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_728.m_name._M_dataplus._M_p != &local_728.m_name.field_2) {
      operator_delete(local_728.m_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._M_dataplus._M_p != &local_898.field_2) {
      operator_delete(local_898._M_dataplus._M_p);
    }
    return;
  }
  version_struct::to_string_abi_cxx11_((string *)local_670,&version);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_670._0_8_,local_670._8_8_);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)local_670);
  exit(0);
}

Assistant:

void parse_diagnostics(options_i& options, vw& all)
{
  bool version_arg = false;
  bool help = false;
  std::string progress_arg;
  option_group_definition diagnostic_group("Diagnostic options");
  diagnostic_group.add(make_option("version", version_arg).help("Version information"))
      .add(make_option("audit", all.audit).short_name("a").help("print weights of features"))
      .add(make_option("progress", progress_arg)
               .short_name("P")
               .help("Progress update frequency. int: additive, float: multiplicative"))
      .add(make_option("quiet", all.quiet).help("Don't output disgnostics and progress updates"))
      .add(make_option("help", help).short_name("h").help("Look here: http://hunch.net/~vw/ and click on Tutorial."));

  options.add_and_parse(diagnostic_group);

  // Upon direct query for version -- spit it out to stdout
  if (version_arg)
  {
    cout << version.to_string() << "\n";
    exit(0);
  }

  if (options.was_supplied("progress") && !all.quiet)
  {
    all.progress_arg = (float)::atof(progress_arg.c_str());
    // --progress interval is dual: either integer or floating-point
    if (progress_arg.find_first_of(".") == string::npos)
    {
      // No "." in arg: assume integer -> additive
      all.progress_add = true;
      if (all.progress_arg < 1)
      {
        all.trace_message << "warning: additive --progress <int>"
                          << " can't be < 1: forcing to 1" << endl;
        all.progress_arg = 1;
      }
      all.sd->dump_interval = all.progress_arg;
    }
    else
    {
      // A "." in arg: assume floating-point -> multiplicative
      all.progress_add = false;

      if (all.progress_arg <= 1.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>: " << progress_arg << " is <= 1.0: adding 1.0"
                          << endl;
        all.progress_arg += 1.0;
      }
      else if (all.progress_arg > 9.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>"
                          << " is > 9.0: you probably meant to use an integer" << endl;
      }
      all.sd->dump_interval = 1.0;
    }
  }
}